

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

Option<const_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
 __thiscall
Lib::
Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::tryGet(Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this,Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> **key)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pPVar4;
  undefined8 *in_RDX;
  ulong uVar5;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pPVar6;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **ppMVar7;
  hash<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_31;
  
  sVar3 = std::hash<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::operator()
                    (&local_31,(Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)*in_RDX)
  ;
  uVar5 = 1;
  if (1 < (uint)sVar3) {
    uVar5 = sVar3 & 0xffffffff;
  }
  pPVar4 = key[1];
  ppMVar7 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **)0x0;
  iVar2 = (int)pPVar4[uVar5 % (ulong)*(uint *)key]._summands._capacity;
  if (iVar2 != 0) {
    pPVar6 = pPVar4 + uVar5 % (ulong)*(uint *)key;
    ppMVar7 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **)0x0;
    do {
      if (iVar2 == (int)uVar5) {
        bVar1 = Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::operator==
                          ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                            *)(pPVar6->_summands)._stack,
                           (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                            *)*in_RDX);
        if (bVar1) {
          ppMVar7 = &(pPVar6->_summands)._cursor;
          break;
        }
        pPVar4 = key[1];
      }
      pPVar6 = pPVar6 + 1;
      if (pPVar6 == key[2]) {
        pPVar6 = pPVar4;
      }
      iVar2 = (int)(pPVar6->_summands)._capacity;
    } while (iVar2 != 0);
  }
  *(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> ***)this = ppMVar7;
  return (OptionBase<const_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
          )(OptionBase<const_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
            )this;
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }